

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O1

int VP8EncTokenLoop(VP8Encoder *enc)

{
  VP8EncProba *proba;
  VP8TBuffer *b;
  ProbaArray (*probas) [8];
  int iVar1;
  VP8RDLevel rd_opt;
  int iVar2;
  long lVar3;
  VP8Encoder *enc_00;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  uint ok;
  int16_t (*paiVar11) [16];
  int16_t (*paiVar12) [16];
  int *piVar13;
  int iVar14;
  long lVar15;
  int16_t (*paiVar16) [16];
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  PassStats stats;
  VP8ModeScore info;
  VP8EncIterator it;
  int local_13b4;
  int local_13a4;
  long local_1390;
  long local_1388;
  PassStats local_1320;
  double local_12e8;
  double dStack_12e0;
  VP8Residual local_12d8;
  VP8ModeScore local_12a8;
  VP8EncIterator local_f38;
  
  iVar8 = enc->mb_w;
  iVar5 = enc->mb_h;
  iVar14 = enc->config->pass;
  iVar1 = enc->do_search;
  rd_opt = enc->rd_opt_level;
  InitPassStats(enc,&local_1320);
  iVar4 = PreLoopInitialize(enc);
  if (iVar4 == 0) {
    iVar8 = 0;
  }
  else {
    proba = &enc->proba;
    iVar10 = iVar8 * iVar5 >> 3;
    iVar4 = 0x60;
    if (0x60 < iVar10) {
      iVar4 = iVar10;
    }
    lVar3 = (long)iVar8 * (long)iVar5 * 0x180;
    b = &enc->tokens;
    auVar23._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar23._0_8_ = lVar3;
    auVar23._12_4_ = 0x45300000;
    dStack_12e0 = auVar23._8_8_ - 1.9342813113834067e+25;
    local_12e8 = (dStack_12e0 + ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) *
                 65025.0;
    probas = (enc->proba).coeffs;
    uVar6 = 1;
    local_13b4 = 0x28;
    do {
      if (uVar6 == 0) {
        uVar6 = 0;
        break;
      }
      if (iVar14 < 1) {
        uVar6 = 1;
        break;
      }
      iVar8 = iVar14 + -1;
      bVar20 = true;
      if ((0.4 < ABS(local_1320.dq)) && (iVar8 != 0)) {
        bVar20 = enc->max_i4_header_bits == 0;
      }
      iVar5 = local_13b4 / (iVar14 + 1);
      VP8IteratorInit(enc,&local_f38);
      SetLoopParams(enc,local_1320.q);
      if (bVar20) {
        memset((enc->proba).stats,0,0x1080);
        VP8InitFilter(&local_f38);
      }
      local_13b4 = local_13b4 - iVar5;
      VP8TBufferClear(b);
      local_1388 = 0;
      local_1390 = 0;
      local_13a4 = iVar4;
      do {
        VP8IteratorImport(&local_f38,(uint8_t *)0x0);
        if (local_13a4 < 1) {
          FinalizeTokenProbas(proba);
          VP8CalculateLevelCosts(proba);
          local_13a4 = iVar4;
        }
        else {
          local_13a4 = local_13a4 + -1;
        }
        VP8Decimate(&local_f38,&local_12a8,rd_opt);
        enc_00 = local_f38.enc;
        VP8IteratorNzToBytes(&local_f38);
        bVar21 = ((uint)*local_f38.mb & 3) != 1;
        if (bVar21) {
          iVar10 = 3;
        }
        else {
          iVar10 = local_f38.left_nz[8] + local_f38.top_nz[8];
          VP8InitResidual(0,1,enc_00,&local_12d8);
          (*VP8SetResidualCoeffs)(local_12a8.y_dc_levels,&local_12d8);
          local_f38.top_nz[8] = VP8RecordCoeffTokens(iVar10,&local_12d8,b);
          iVar10 = 0;
          local_f38.left_nz[8] = local_f38.top_nz[8];
        }
        VP8InitResidual((uint)!bVar21,iVar10,enc_00,&local_12d8);
        paiVar11 = local_12a8.y_ac_levels;
        lVar15 = 0;
        do {
          lVar17 = 0x21;
          paiVar12 = paiVar11;
          do {
            iVar10 = local_f38.left_nz[lVar15];
            iVar2 = *(int *)(local_f38.i4_boundary + lVar17 * 4 + -0x50);
            (*VP8SetResidualCoeffs)(*paiVar12,&local_12d8);
            iVar10 = VP8RecordCoeffTokens(iVar10 + iVar2,&local_12d8,b);
            local_f38.left_nz[lVar15] = iVar10;
            *(int *)(local_f38.i4_boundary + lVar17 * 4 + -0x50) = iVar10;
            lVar17 = lVar17 + 1;
            paiVar12 = paiVar12 + 1;
          } while (lVar17 != 0x25);
          lVar15 = lVar15 + 1;
          paiVar11 = paiVar11 + 4;
        } while (lVar15 != 4);
        VP8InitResidual(0,2,enc_00,&local_12d8);
        piVar13 = local_f38.top_nz + 4;
        paiVar11 = local_12a8.uv_levels;
        uVar9 = 0;
        do {
          paiVar12 = paiVar11;
          uVar18 = 0;
          do {
            uVar19 = uVar18 | uVar9 | 4;
            lVar15 = 0;
            paiVar16 = paiVar12;
            do {
              iVar10 = local_f38.left_nz[uVar19];
              iVar2 = piVar13[lVar15];
              (*VP8SetResidualCoeffs)(*paiVar16,&local_12d8);
              iVar10 = VP8RecordCoeffTokens(iVar10 + iVar2,&local_12d8,b);
              local_f38.left_nz[uVar19] = iVar10;
              piVar13[lVar15] = iVar10;
              lVar15 = lVar15 + 1;
              paiVar16 = paiVar16 + 1;
            } while (lVar15 == 1);
            paiVar12 = paiVar12 + 2;
            bVar21 = uVar18 == 0;
            uVar18 = uVar18 + 1;
          } while (bVar21);
          paiVar11 = paiVar11 + 4;
          piVar13 = piVar13 + 2;
          bVar21 = uVar9 == 0;
          uVar9 = uVar9 + 2;
        } while (bVar21);
        VP8IteratorBytesToNz(&local_f38);
        iVar10 = (enc->tokens).error;
        if (iVar10 == 0) {
          local_1388 = local_1388 + local_12a8.H;
          local_1390 = local_1390 + local_12a8.D;
          if (bVar20) {
            StoreSideInfo(&local_f38);
            VP8StoreFilterStats(&local_f38);
            VP8IteratorExport(&local_f38);
            uVar6 = VP8IteratorProgress(&local_f38,iVar5);
          }
          else {
            uVar6 = (uint)(iVar10 == 0);
          }
          VP8IteratorSaveBoundary(&local_f38);
        }
        else {
          WebPEncodingSetError(enc->pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
          uVar6 = 0;
        }
      } while (((iVar10 == 0) && (uVar6 != 0)) &&
              (iVar10 = VP8IteratorNext(&local_f38), iVar10 != 0));
      if (uVar6 == 0) {
        bVar20 = true;
        iVar14 = iVar8;
      }
      else {
        uVar9 = local_1388 + (enc->segment_hdr).size;
        if (local_1320.do_size_search == 0) {
          dVar22 = 99.0;
          if (local_1390 != 0 && lVar3 != 0) {
            auVar24._8_4_ = (int)((ulong)local_1390 >> 0x20);
            auVar24._0_8_ = local_1390;
            auVar24._12_4_ = 0x45300000;
            dVar22 = log10(local_12e8 /
                           ((auVar24._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)local_1390) - 4503599627370496.0)));
            dVar22 = dVar22 * 10.0;
          }
        }
        else {
          iVar5 = FinalizeTokenProbas(proba);
          sVar7 = VP8EstimateTokenSize(b,(uint8_t *)probas);
          dVar22 = (double)((sVar7 + (long)iVar5 + uVar9 + 0x400 >> 0xb) + 0x1e);
        }
        local_1320.value = dVar22;
        if ((enc->max_i4_header_bits < 1) || (uVar9 < 0x3fc00001)) {
          iVar14 = iVar8;
          if (iVar1 != 0 && !bVar20) {
            ComputeNextQ(&local_1320);
            bVar20 = false;
          }
        }
        else {
          enc->max_i4_header_bits = (uint)enc->max_i4_header_bits >> 1;
          if (bVar20) {
            if ((local_f38.enc)->pic->stats != (WebPAuxStats *)0x0) {
              (local_f38.enc)->block_count[2] = 0;
              (local_f38.enc)->block_count[0] = 0;
              (local_f38.enc)->block_count[1] = 0;
            }
            (local_f38.enc)->sse_count = 0;
            (local_f38.enc)->sse[0] = 0;
            (local_f38.enc)->sse[1] = 0;
            (local_f38.enc)->sse[2] = 0;
          }
          bVar20 = false;
        }
      }
    } while (!bVar20);
    ok = 0;
    if (uVar6 != 0) {
      if (local_1320.do_size_search == 0) {
        FinalizeTokenProbas(proba);
      }
      iVar8 = VP8EmitTokens(b,enc->parts,(uint8_t *)probas,1);
      if (iVar8 != 0) {
        iVar8 = WebPReportProgress(enc->pic,local_13b4 + enc->percent,&enc->percent);
        ok = (uint)(iVar8 != 0);
      }
    }
    iVar8 = PostLoopFinalize(&local_f38,ok);
  }
  return iVar8;
}

Assistant:

int VP8EncTokenLoop(VP8Encoder* const enc) {
  // Roughly refresh the proba eight times per pass
  int max_count = (enc->mb_w * enc->mb_h) >> 3;
  int num_pass_left = enc->config->pass;
  int remaining_progress = 40;  // percents
  const int do_search = enc->do_search;
  VP8EncIterator it;
  VP8EncProba* const proba = &enc->proba;
  const VP8RDLevel rd_opt = enc->rd_opt_level;
  const uint64_t pixel_count = (uint64_t)enc->mb_w * enc->mb_h * 384;
  PassStats stats;
  int ok;

  InitPassStats(enc, &stats);
  ok = PreLoopInitialize(enc);
  if (!ok) return 0;

  if (max_count < MIN_COUNT) max_count = MIN_COUNT;

  assert(enc->num_parts == 1);
  assert(enc->use_tokens);
  assert(proba->use_skip_proba == 0);
  assert(rd_opt >= RD_OPT_BASIC);   // otherwise, token-buffer won't be useful
  assert(num_pass_left > 0);

  while (ok && num_pass_left-- > 0) {
    const int is_last_pass = (fabs(stats.dq) <= DQ_LIMIT) ||
                             (num_pass_left == 0) ||
                             (enc->max_i4_header_bits == 0);
    uint64_t size_p0 = 0;
    uint64_t distortion = 0;
    int cnt = max_count;
    // The final number of passes is not trivial to know in advance.
    const int pass_progress = remaining_progress / (2 + num_pass_left);
    remaining_progress -= pass_progress;
    VP8IteratorInit(enc, &it);
    SetLoopParams(enc, stats.q);
    if (is_last_pass) {
      ResetTokenStats(enc);
      VP8InitFilter(&it);  // don't collect stats until last pass (too costly)
    }
    VP8TBufferClear(&enc->tokens);
    do {
      VP8ModeScore info;
      VP8IteratorImport(&it, NULL);
      if (--cnt < 0) {
        FinalizeTokenProbas(proba);
        VP8CalculateLevelCosts(proba);  // refresh cost tables for rd-opt
        cnt = max_count;
      }
      VP8Decimate(&it, &info, rd_opt);
      ok = RecordTokens(&it, &info, &enc->tokens);
      if (!ok) {
        WebPEncodingSetError(enc->pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
        break;
      }
      size_p0 += info.H;
      distortion += info.D;
      if (is_last_pass) {
        StoreSideInfo(&it);
        VP8StoreFilterStats(&it);
        VP8IteratorExport(&it);
        ok = VP8IteratorProgress(&it, pass_progress);
      }
      VP8IteratorSaveBoundary(&it);
    } while (ok && VP8IteratorNext(&it));
    if (!ok) break;

    size_p0 += enc->segment_hdr.size;
    if (stats.do_size_search) {
      uint64_t size = FinalizeTokenProbas(&enc->proba);
      size += VP8EstimateTokenSize(&enc->tokens,
                                   (const uint8_t*)proba->coeffs);
      size = (size + size_p0 + 1024) >> 11;  // -> size in bytes
      size += HEADER_SIZE_ESTIMATE;
      stats.value = (double)size;
    } else {  // compute and store PSNR
      stats.value = GetPSNR(distortion, pixel_count);
    }

#if (DEBUG_SEARCH > 0)
    printf("#%2d metric:%.1lf -> %.1lf   last_q=%.2lf q=%.2lf dq=%.2lf "
           " range:[%.1f, %.1f]\n",
           num_pass_left, stats.last_value, stats.value,
           stats.last_q, stats.q, stats.dq, stats.qmin, stats.qmax);
#endif
    if (enc->max_i4_header_bits > 0 && size_p0 > PARTITION0_SIZE_LIMIT) {
      ++num_pass_left;
      enc->max_i4_header_bits >>= 1;  // strengthen header bit limitation...
      if (is_last_pass) {
        ResetSideInfo(&it);
      }
      continue;                        // ...and start over
    }
    if (is_last_pass) {
      break;   // done
    }
    if (do_search) {
      ComputeNextQ(&stats);  // Adjust q
    }
  }
  if (ok) {
    if (!stats.do_size_search) {
      FinalizeTokenProbas(&enc->proba);
    }
    ok = VP8EmitTokens(&enc->tokens, enc->parts + 0,
                       (const uint8_t*)proba->coeffs, 1);
  }
  ok = ok && WebPReportProgress(enc->pic, enc->percent + remaining_progress,
                                &enc->percent);
  return PostLoopFinalize(&it, ok);
}